

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_quantize_avx.c
# Opt level: O1

void aom_quantize_b_avx(tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr
                       ,int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
                       tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
                       int16_t *iscan)

{
  tran_low_t *ptVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  *eob_ptr = 0;
  auVar14 = *(undefined1 (*) [16])round_ptr;
  auVar2 = *(undefined1 (*) [16])quant_ptr;
  auVar17 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar7 = vpaddw_avx(auVar17,*(undefined1 (*) [16])zbin_ptr);
  auVar17 = *(undefined1 (*) [16])dequant_ptr;
  auVar16 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar5 = vpackssdw_avx(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar6 = vpackssdw_avx(*(undefined1 (*) [16])(coeff_ptr + 8),
                         *(undefined1 (*) [16])(coeff_ptr + 0xc));
  auVar3 = vpabsw_avx(auVar5);
  auVar4 = vpabsw_avx(auVar6);
  auVar8 = vpcmpgtw_avx(auVar3,auVar7);
  auVar10 = vpshufd_avx(auVar7,0xee);
  auVar7 = vpcmpgtw_avx(auVar4,auVar10);
  auVar9 = vpor_avx(auVar7,auVar8);
  if (auVar9 == (undefined1  [16])0x0) {
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    dqcoeff_ptr[4] = 0;
    dqcoeff_ptr[5] = 0;
    dqcoeff_ptr[6] = 0;
    dqcoeff_ptr[7] = 0;
    qcoeff_ptr[8] = 0;
    qcoeff_ptr[9] = 0;
    qcoeff_ptr[10] = 0;
    qcoeff_ptr[0xb] = 0;
    qcoeff_ptr[0xc] = 0;
    qcoeff_ptr[0xd] = 0;
    qcoeff_ptr[0xe] = 0;
    qcoeff_ptr[0xf] = 0;
    dqcoeff_ptr[8] = 0;
    dqcoeff_ptr[9] = 0;
    dqcoeff_ptr[10] = 0;
    dqcoeff_ptr[0xb] = 0;
    dqcoeff_ptr[0xc] = 0;
    dqcoeff_ptr[0xd] = 0;
    dqcoeff_ptr[0xe] = 0;
    dqcoeff_ptr[0xf] = 0;
    if (n_coeffs == 0x10) {
      return;
    }
    auVar11 = vpshufd_avx(auVar14,0xee);
    auVar12 = vpshufd_avx(auVar2,0xee);
    auVar9 = vpshufd_avx(auVar16,0xee);
    auVar3 = vpshufd_avx(auVar17,0xee);
    auVar15 = ZEXT1664((undefined1  [16])0x0);
  }
  else {
    auVar3 = vpaddsw_avx(auVar3,auVar14);
    auVar9 = vpmulhw_avx(auVar3,auVar2);
    auVar3 = vpaddw_avx(auVar9,auVar3);
    auVar3 = vpmulhw_avx(auVar3,auVar16);
    auVar11 = vpshufd_avx(auVar14,0xee);
    auVar12 = vpshufd_avx(auVar2,0xee);
    auVar9 = vpshufd_avx(auVar16,0xee);
    auVar14 = vpaddsw_avx(auVar4,auVar11);
    auVar2 = vpmulhw_avx(auVar14,auVar12);
    auVar14 = vpaddw_avx(auVar2,auVar14);
    auVar14 = vpmulhw_avx(auVar14,auVar9);
    auVar2 = vpsignw_avx(auVar3,auVar5);
    auVar16 = vpsignw_avx(auVar14,auVar6);
    auVar14 = vpand_avx(auVar8,auVar2);
    auVar2 = vpand_avx(auVar16,auVar7);
    auVar16 = vpsraw_avx(auVar14,0xf);
    auVar3 = vpunpcklwd_avx(auVar14,auVar16);
    auVar16 = vpunpckhwd_avx(auVar14,auVar16);
    *(undefined1 (*) [16])qcoeff_ptr = auVar3;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = auVar16;
    auVar16 = vpsraw_avx(auVar2,0xf);
    auVar3 = vpunpcklwd_avx(auVar2,auVar16);
    auVar16 = vpunpckhwd_avx(auVar2,auVar16);
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar3;
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = auVar16;
    auVar3 = vpmullw_avx(auVar14,auVar17);
    auVar16 = vpmulhw_avx(auVar14,auVar17);
    auVar4 = vpunpcklwd_avx(auVar3,auVar16);
    auVar16 = vpunpckhwd_avx(auVar3,auVar16);
    *(undefined1 (*) [16])dqcoeff_ptr = auVar4;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = auVar16;
    auVar3 = vpshufd_avx(auVar17,0xee);
    auVar16 = vpmullw_avx(auVar2,auVar3);
    auVar17 = vpmulhw_avx(auVar2,auVar3);
    auVar4 = vpunpcklwd_avx(auVar16,auVar17);
    auVar17 = vpunpckhwd_avx(auVar16,auVar17);
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = auVar4;
    *(undefined1 (*) [16])(dqcoeff_ptr + 0xc) = auVar17;
    auVar17 = vpsubw_avx(*(undefined1 (*) [16])iscan,auVar8);
    auVar16 = vpsubw_avx(*(undefined1 (*) [16])(iscan + 8),auVar7);
    auVar14 = vpcmpeqw_avx((undefined1  [16])0x0,auVar14);
    auVar14 = vpandn_avx(auVar14,auVar17);
    auVar2 = vpcmpeqw_avx(auVar2,(undefined1  [16])0x0);
    auVar2 = vpandn_avx(auVar2,auVar16);
    auVar14 = vpmaxsw_avx(auVar14,auVar2);
    auVar15 = ZEXT1664(auVar14);
  }
  auVar14 = auVar15._0_16_;
  if (0x10 < n_coeffs) {
    lVar13 = 0x10;
    do {
      auVar17 = vpackssdw_avx(*(undefined1 (*) [16])(coeff_ptr + lVar13),
                              *(undefined1 (*) [16])(coeff_ptr + lVar13 + 4));
      auVar16 = vpackssdw_avx(*(undefined1 (*) [16])(coeff_ptr + lVar13 + 8),
                              *(undefined1 (*) [16])(coeff_ptr + lVar13 + 0xc));
      auVar14 = vpabsw_avx(auVar17);
      auVar2 = vpabsw_avx(auVar16);
      auVar4 = vpcmpgtw_avx(auVar14,auVar10);
      auVar5 = vpcmpgtw_avx(auVar2,auVar10);
      auVar6 = vpor_avx(auVar5,auVar4);
      if (auVar6 == (undefined1  [16])0x0) {
        ptVar1 = qcoeff_ptr + lVar13;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = dqcoeff_ptr + lVar13;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = qcoeff_ptr + lVar13 + 8;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = dqcoeff_ptr + lVar13 + 8;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
      }
      else {
        auVar14 = vpaddsw_avx(auVar14,auVar11);
        auVar6 = vpmulhw_avx(auVar14,auVar12);
        auVar14 = vpaddw_avx(auVar6,auVar14);
        auVar6 = vpmulhw_avx(auVar14,auVar9);
        auVar14 = vpaddsw_avx(auVar2,auVar11);
        auVar2 = vpmulhw_avx(auVar14,auVar12);
        auVar14 = vpaddw_avx(auVar2,auVar14);
        auVar14 = vpmulhw_avx(auVar14,auVar9);
        auVar2 = vpsignw_avx(auVar6,auVar17);
        auVar17 = vpsignw_avx(auVar14,auVar16);
        auVar14 = vpand_avx(auVar4,auVar2);
        auVar2 = vpand_avx(auVar5,auVar17);
        auVar17 = vpsraw_avx(auVar14,0xf);
        auVar16 = vpunpcklwd_avx(auVar14,auVar17);
        auVar17 = vpunpckhwd_avx(auVar14,auVar17);
        *(undefined1 (*) [16])(qcoeff_ptr + lVar13) = auVar16;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar13 + 4) = auVar17;
        auVar17 = vpsraw_avx(auVar2,0xf);
        auVar16 = vpunpcklwd_avx(auVar2,auVar17);
        auVar17 = vpunpckhwd_avx(auVar2,auVar17);
        *(undefined1 (*) [16])(qcoeff_ptr + lVar13 + 8) = auVar16;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar13 + 0xc) = auVar17;
        auVar16 = vpmullw_avx(auVar14,auVar3);
        auVar17 = vpmulhw_avx(auVar14,auVar3);
        auVar6 = vpunpcklwd_avx(auVar16,auVar17);
        auVar17 = vpunpckhwd_avx(auVar16,auVar17);
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar13) = auVar6;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar13 + 4) = auVar17;
        auVar16 = vpmullw_avx(auVar2,auVar3);
        auVar17 = vpmulhw_avx(auVar2,auVar3);
        auVar6 = vpunpcklwd_avx(auVar16,auVar17);
        auVar17 = vpunpckhwd_avx(auVar16,auVar17);
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar13 + 8) = auVar6;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar13 + 0xc) = auVar17;
        auVar17 = vpsubw_avx(*(undefined1 (*) [16])(iscan + lVar13),auVar4);
        auVar16 = vpsubw_avx(*(undefined1 (*) [16])(iscan + lVar13 + 8),auVar5);
        auVar14 = vpcmpeqw_avx(auVar14,(undefined1  [16])0x0);
        auVar14 = vpandn_avx(auVar14,auVar17);
        auVar2 = vpcmpeqw_avx(auVar2,(undefined1  [16])0x0);
        auVar2 = vpandn_avx(auVar2,auVar16);
        auVar14 = vpmaxsw_avx(auVar14,auVar2);
        auVar14 = vpmaxsw_avx(auVar14,auVar15._0_16_);
        auVar15 = ZEXT1664(auVar14);
      }
      auVar14 = auVar15._0_16_;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 < n_coeffs);
  }
  auVar2 = vpshufd_avx(auVar14,0xe);
  auVar14 = vpmaxsw_avx(auVar14,auVar2);
  auVar2 = vpshuflw_avx(auVar14,0xe);
  auVar14 = vpmaxsw_avx(auVar14,auVar2);
  auVar2 = vpshuflw_avx(auVar14,1);
  auVar14 = vpmaxsw_avx(auVar14,auVar2);
  vpextrw_avx(auVar14,1);
  return;
}

Assistant:

void aom_quantize_b_avx(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                        const int16_t *zbin_ptr, const int16_t *round_ptr,
                        const int16_t *quant_ptr,
                        const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
                        tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr,
                        uint16_t *eob_ptr, const int16_t *scan,
                        const int16_t *iscan) {
  const __m128i zero = _mm_setzero_si128();
  const __m256i big_zero = _mm256_setzero_si256();
  int index;

  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i eob = zero, eob0;

  (void)scan;

  *eob_ptr = 0;

  load_b_values(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff0 = load_tran_low(coeff_ptr);
  coeff1 = load_tran_low(coeff_ptr + 8);

  qcoeff0 = _mm_abs_epi16(coeff0);
  qcoeff1 = _mm_abs_epi16(coeff1);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_test_all_zeros(all_zero, all_zero)) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), big_zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), big_zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), big_zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), big_zero);

    if (n_coeffs == 16) return;

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff(&qcoeff0, round, quant, shift);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff(&qcoeff1, round, quant, shift);

    // Reinsert signs
    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_tran_low(qcoeff0, qcoeff_ptr);
    store_tran_low(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store(qcoeff0, dequant, dqcoeff_ptr);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store(qcoeff1, dequant, dqcoeff_ptr + 8);

    eob =
        scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, 0, zero);
  }

  // AC only loop.
  for (index = 16; index < n_coeffs; index += 16) {
    coeff0 = load_tran_low(coeff_ptr + index);
    coeff1 = load_tran_low(coeff_ptr + index + 8);

    qcoeff0 = _mm_abs_epi16(coeff0);
    qcoeff1 = _mm_abs_epi16(coeff1);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_test_all_zeros(all_zero, all_zero)) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), big_zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), big_zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), big_zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), big_zero);
      continue;
    }

    calculate_qcoeff(&qcoeff0, round, quant, shift);
    calculate_qcoeff(&qcoeff1, round, quant, shift);

    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_tran_low(qcoeff0, qcoeff_ptr + index);
    store_tran_low(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store(qcoeff0, dequant, dqcoeff_ptr + index);
    calculate_dqcoeff_and_store(qcoeff1, dequant, dqcoeff_ptr + index + 8);

    eob0 = scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, index,
                        zero);
    eob = _mm_max_epi16(eob, eob0);
  }

  *eob_ptr = accumulate_eob(eob);
}